

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::XmlReporter::testGroupStarting(XmlReporter *this,GroupInfo *groupInfo)

{
  char *pcVar1;
  pointer pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  size_t sVar5;
  XmlWriter *this_00;
  string local_60;
  string local_40;
  
  Option<Catch::GroupInfo>::reset
            (&(this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>);
  pcVar1 = (this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.
           storage;
  *(char **)(this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.
            storage =
       (this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.storage +
       0x10;
  pcVar2 = (groupInfo->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)pcVar1,pcVar2,pcVar2 + (groupInfo->name)._M_string_length);
  uVar3 = *(undefined4 *)((long)&groupInfo->groupIndex + 4);
  sVar5 = groupInfo->groupsCounts;
  uVar4 = *(undefined4 *)((long)&groupInfo->groupsCounts + 4);
  *(int *)((this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.
           storage + 0x20) = (int)groupInfo->groupIndex;
  *(undefined4 *)
   ((this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.storage +
   0x24) = uVar3;
  *(int *)((this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.
           storage + 0x28) = (int)sVar5;
  *(undefined4 *)
   ((this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.storage +
   0x2c) = uVar4;
  (this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>.nullableValue
       = (GroupInfo *)pcVar1;
  (this->super_StreamingReporterBase).currentGroupInfo.used = false;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Group","");
  this_00 = XmlWriter::startElement(&this->m_xml,&local_40);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"name","");
  XmlWriter::writeAttribute(this_00,&local_60,&groupInfo->name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

virtual void testGroupStarting( GroupInfo const& groupInfo ) {
            StreamingReporterBase::testGroupStarting( groupInfo );
            m_xml.startElement( "Group" )
                .writeAttribute( "name", groupInfo.name );
        }